

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

int xmlNoNetExists(char *filename)

{
  int iVar1;
  char *pcStack_20;
  int ret;
  char *fromUri;
  char *filename_local;
  
  if (filename == (char *)0x0) {
    filename_local._4_4_ = 0;
  }
  else {
    fromUri = filename;
    iVar1 = xmlConvertUriToPath(filename,&stack0xffffffffffffffe0);
    if (iVar1 < 0) {
      filename_local._4_4_ = 0;
    }
    else {
      if (pcStack_20 != (char *)0x0) {
        fromUri = pcStack_20;
      }
      iVar1 = xmlCheckFilename(fromUri);
      (*xmlFree)(pcStack_20);
      filename_local._4_4_ = iVar1;
    }
  }
  return filename_local._4_4_;
}

Assistant:

int
xmlNoNetExists(const char *filename) {
    char *fromUri;
    int ret;

    if (filename == NULL)
	return(0);

    if (xmlConvertUriToPath(filename, &fromUri) < 0)
        return(0);

    if (fromUri != NULL)
        filename = fromUri;

    ret =  xmlCheckFilename(filename);

    xmlFree(fromUri);
    return(ret);
}